

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_clock.cc
# Opt level: O0

QuicTime __thiscall
quic::QuicClock::ConvertWallTimeToQuicTime(QuicClock *this,QuicWallTime *walltime)

{
  int iVar1;
  uint64_t uVar2;
  int64_t iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Delta delta;
  QuicWallTime local_58;
  QuicWallTime local_50;
  int64_t local_48;
  QuicTime local_40;
  int64_t local_38;
  QuicTime local_30;
  int64_t local_28;
  int64_t time_in_us;
  QuicWallTime *walltime_local;
  QuicClock *this_local;
  
  time_in_us = (int64_t)walltime;
  walltime_local = (QuicWallTime *)this;
  if ((this->is_calibrated_ & 1U) == 0) {
    iVar1 = (*this->_vptr_QuicClock[3])();
    local_40.time_ = CONCAT44(extraout_var,iVar1);
    iVar1 = (*this->_vptr_QuicClock[4])();
    local_58.microseconds_ = CONCAT44(extraout_var_00,iVar1);
    uVar2 = QuicWallTime::ToUNIXMicroseconds((QuicWallTime *)time_in_us);
    delta = QuicTime::Delta::FromMicroseconds(uVar2);
    local_50 = QuicWallTime::Subtract(&local_58,delta);
    uVar2 = QuicWallTime::ToUNIXMicroseconds(&local_50);
    local_48 = (int64_t)QuicTime::Delta::FromMicroseconds(uVar2);
    this_local = (QuicClock *)operator-(local_40,(Delta)local_48);
  }
  else {
    uVar2 = QuicWallTime::ToUNIXMicroseconds(walltime);
    iVar3 = QuicTime::Delta::ToMicroseconds(&this->calibration_offset_);
    local_28 = uVar2 - iVar3;
    local_30 = QuicTime::Zero();
    local_38 = (int64_t)QuicTime::Delta::FromMicroseconds(local_28);
    this_local = (QuicClock *)operator+(local_30,(Delta)local_38);
  }
  return (QuicTime)(int64_t)this_local;
}

Assistant:

QuicTime QuicClock::ConvertWallTimeToQuicTime(
		const QuicWallTime& walltime) const {
		if (is_calibrated_) {
			int64_t time_in_us = static_cast<int64_t>(walltime.ToUNIXMicroseconds()) -
				calibration_offset_.ToMicroseconds();
			return QuicTime::Zero() + QuicTime::Delta::FromMicroseconds(time_in_us);
		}

		//     ..........................
		//     |            |           |
		// unix epoch   |walltime|   WallNow()
		//     ..........................
		//            |     |           |
		//     clock epoch  |         Now()
		//               result
		//
		// result = Now() - (WallNow() - walltime)
		return Now() - QuicTime::Delta::FromMicroseconds(
			WallNow()
			.Subtract(QuicTime::Delta::FromMicroseconds(
				walltime.ToUNIXMicroseconds()))
			.ToUNIXMicroseconds());
	}